

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterB.c
# Opt level: O2

int Intb_ManGetGlobalVar(Intb_Man_t *p,int Var)

{
  uint uVar1;
  
  if (-1 < p->pVarTypes[Var]) {
    return -1;
  }
  uVar1 = ~p->pVarTypes[Var];
  if ((int)uVar1 < p->vVarsAB->nSize) {
    return uVar1;
  }
  __assert_fail("VarAB >= 0 && VarAB < Vec_IntSize(p->vVarsAB)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satInterB.c"
                ,0x229,"int Intb_ManGetGlobalVar(Intb_Man_t *, int)");
}

Assistant:

int Intb_ManGetGlobalVar( Intb_Man_t * p, int Var )
{
    int VarAB;
    if ( p->pVarTypes[Var] >= 0 ) // global var
        return -1;
    VarAB = -p->pVarTypes[Var]-1;
    assert( VarAB >= 0 && VarAB < Vec_IntSize(p->vVarsAB) );
    return VarAB;
}